

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vpu_mem_legacy.c
# Opt level: O0

RK_S32 put_used_memory_handle(vpu_display_mem_pool *p,void *hdl)

{
  long lVar1;
  MppBuffer buf;
  VPUMemLinear_t *dmabuf;
  void *hdl_local;
  vpu_display_mem_pool *p_local;
  
  lVar1 = *(long *)((long)hdl + 0x18);
  if ((vpu_mem_debug & 1) != 0) {
    _mpp_log_l(4,0,"pool %p hnd %p buffer %p\n","put_used_memory_handle",p,hdl,lVar1);
  }
  if (lVar1 != 0) {
    mpp_buffer_put_with_caller(lVar1);
    memset(hdl,0,0x20);
  }
  return 0;
}

Assistant:

static RK_S32 put_used_memory_handle(vpu_display_mem_pool *p, void *hdl)
{
    VPUMemLinear_t *dmabuf = (VPUMemLinear_t *)hdl;
    MppBuffer buf = (MppBuffer)dmabuf->offset;
    vpu_mem_dbg_func("pool %p hnd %p buffer %p\n", p, hdl, buf);
    if (buf != NULL) {
        mpp_buffer_put(buf);
        memset(dmabuf, 0, sizeof(VPUMemLinear_t));
    }
    (void)p;
    return MPP_OK;
}